

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int compression_end_deflate(archive *a,la_zstream *lastrm)

{
  z_streamp strm_00;
  int iVar1;
  int r;
  z_stream *strm;
  la_zstream *lastrm_local;
  archive *a_local;
  
  strm_00 = (z_streamp)lastrm->real_stream;
  iVar1 = cm_zlib_deflateEnd(strm_00);
  free(strm_00);
  lastrm->real_stream = (void *)0x0;
  lastrm->valid = 0;
  if (iVar1 == 0) {
    a_local._4_4_ = 0;
  }
  else {
    archive_set_error(a,-1,"Failed to clean up compressor");
    a_local._4_4_ = -0x1e;
  }
  return a_local._4_4_;
}

Assistant:

static int
compression_end_deflate(struct archive *a, struct la_zstream *lastrm)
{
	z_stream *strm;
	int r;

	strm = (z_stream *)lastrm->real_stream;
	r = deflateEnd(strm);
	free(strm);
	lastrm->real_stream = NULL;
	lastrm->valid = 0;
	if (r != Z_OK) {
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "Failed to clean up compressor");
		return (ARCHIVE_FATAL);
	}
	return (ARCHIVE_OK);
}